

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter>::
visit<slang::syntax::TypedefDeclarationSyntax&>
          (SyntaxVisitor<InterleavedRewriter> *this,TypedefDeclarationSyntax *t)

{
  TypedefDeclarationSyntax *in_stack_000001a0;
  InterleavedRewriter *in_stack_000001a8;
  
  CATCH2_INTERNAL_TEST_8()::InterleavedRewriter::handle(slang::syntax::
  TypedefDeclarationSyntax_const__(in_stack_000001a8,in_stack_000001a0);
  return;
}

Assistant:

void visit(T&& t) {
        if constexpr (requires { DERIVED->handle(t); })
            DERIVED->handle(t);
        else
            DERIVED->visitDefault(t);
    }